

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int UTF16LEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_74;
  int bits;
  uchar *tmp;
  uint local_60;
  uint inlen;
  uint d;
  uint c;
  unsigned_short *inend;
  unsigned_short *in;
  uchar *outend;
  uchar *processed;
  uchar *outstart;
  int *inlenb_local;
  uchar *inb_local;
  int *outlen_local;
  uchar *out_local;
  
  if (*outlen == 0) {
    *inlenb = 0;
    return 0;
  }
  iVar2 = *outlen;
  if (*inlenb % 2 == 1) {
    *inlenb = *inlenb + -1;
  }
  iVar3 = *inlenb;
  outend = inb;
  outlen_local = (int *)out;
  do {
    bVar4 = false;
    if (outend < inb + (ulong)(uint)(iVar3 / 2) * 2) {
      bVar4 = (long)outlen_local + (5 - (long)out) < (long)*outlen;
    }
    if (!bVar4) goto LAB_0014f3ec;
    if (xmlLittleEndian == 0) {
      uVar1 = *(ushort *)outend;
    }
    else {
      uVar1 = *(ushort *)outend;
    }
    inend = (unsigned_short *)(outend + 2);
    inlen = (uint)uVar1;
    if ((inlen & 0xfc00) == 0xd800) {
      if (inb + (ulong)(uint)(iVar3 / 2) * 2 <= inend) {
LAB_0014f3ec:
        *outlen = (int)outlen_local - (int)out;
        *inlenb = (int)outend - (int)inb;
        return *outlen;
      }
      if (xmlLittleEndian == 0) {
        uVar1 = *inend;
      }
      else {
        uVar1 = *inend;
      }
      inend = (unsigned_short *)(outend + 4);
      local_60 = (uint)uVar1;
      if ((local_60 & 0xfc00) != 0xdc00) {
        *outlen = (int)outlen_local - (int)out;
        *inlenb = (int)outend - (int)inb;
        return -2;
      }
      inlen = (local_60 & 0x3ff | (inlen & 0x3ff) << 10) + 0x10000;
    }
    if (out + iVar2 <= outlen_local) goto LAB_0014f3ec;
    if (inlen < 0x80) {
      *(char *)outlen_local = (char)inlen;
      local_74 = -6;
    }
    else if (inlen < 0x800) {
      *(byte *)outlen_local = (byte)(inlen >> 6) & 0x1f | 0xc0;
      local_74 = 0;
    }
    else if (inlen < 0x10000) {
      *(byte *)outlen_local = (byte)(inlen >> 0xc) & 0xf | 0xe0;
      local_74 = 6;
    }
    else {
      *(byte *)outlen_local = (byte)(inlen >> 0x12) | 0xf0;
      local_74 = 0xc;
    }
    while ((outlen_local = (int *)((long)outlen_local + 1), -1 < local_74 &&
           (outlen_local < out + iVar2))) {
      *(byte *)outlen_local = (byte)(inlen >> ((byte)local_74 & 0x1f)) & 0x3f | 0x80;
      local_74 = local_74 + -6;
    }
    outend = (uchar *)inend;
  } while( true );
}

Assistant:

static int
UTF16LEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if (*outlen == 0) {
        *inlenb = 0;
        return(0);
    }
    outend = out + *outlen;
    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend = in + inlen;
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
        if (xmlLittleEndian) {
	    c= *in++;
	} else {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c | (((unsigned int)*tmp) << 8);
	    in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		break;
	    }
	    if (xmlLittleEndian) {
		d = *in++;
	    } else {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d | (((unsigned int)*tmp) << 8);
		in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}